

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
* __thiscall
llvm::
DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
::operator++(DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
             *this)

{
  bool bVar1;
  DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
  *this_local;
  
  bVar1 = DebugEpochBase::HandleBase::isHandleInSync((HandleBase *)this);
  if (!bVar1) {
    __assert_fail("isHandleInSync() && \"invalid iterator access!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/DenseMap.h"
                  ,0x4cf,
                  "DenseMapIterator<KeyT, ValueT, KeyInfoT, Bucket, IsConst> &llvm::DenseMapIterator<unsigned long, unsigned long>::operator++() [KeyT = unsigned long, ValueT = unsigned long, KeyInfoT = llvm::DenseMapInfo<unsigned long>, Bucket = llvm::detail::DenseMapPair<unsigned long, unsigned long>, IsConst = false]"
                 );
  }
  bVar1 = shouldReverseIterate<unsigned_long>();
  if (bVar1) {
    this->Ptr = this->Ptr + -1;
    RetreatPastEmptyBuckets(this);
  }
  else {
    this->Ptr = this->Ptr + 1;
    AdvancePastEmptyBuckets(this);
  }
  return this;
}

Assistant:

inline DenseMapIterator& operator++() {  // Preincrement
    assert(isHandleInSync() && "invalid iterator access!");
    if (shouldReverseIterate<KeyT>()) {
      --Ptr;
      RetreatPastEmptyBuckets();
      return *this;
    }
    ++Ptr;
    AdvancePastEmptyBuckets();
    return *this;
  }